

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O3

exr_result_t
exr_attr_get_double(exr_const_context_t_conflict ctxt,int part_index,char *name,double *out)

{
  exr_result_t eVar1;
  exr_attribute_t *in_RAX;
  exr_context_t nonc;
  exr_attribute_t *attr;
  exr_attribute_t *local_28;
  
  if (ctxt == (exr_const_context_t_conflict)0x0) {
    return 2;
  }
  local_28 = in_RAX;
  if (ctxt->mode == '\x01') {
    pthread_mutex_lock((pthread_mutex_t *)&ctxt->mutex);
  }
  if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
    if (ctxt->mode == '\x01') {
      pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
    }
    eVar1 = (*ctxt->print_error)
                      (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                       ctxt->print_error);
    return eVar1;
  }
  if ((name == (char *)0x0) || (*name == '\0')) {
    if (ctxt->mode == '\x01') {
      pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
    }
    eVar1 = (*ctxt->report_error)(ctxt,3,"Invalid name for d attribute query");
    return eVar1;
  }
  eVar1 = exr_attr_list_find_by_name(ctxt,&ctxt->parts[(uint)part_index]->attributes,name,&local_28)
  ;
  if (eVar1 == 0) {
    if (local_28->type != EXR_ATTR_DOUBLE) {
      if (ctxt->mode == '\x01') {
        pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
      }
      eVar1 = (*ctxt->print_error)
                        (ctxt,0x10,
                         "\'%s\' requested type \'d\', but stored attributes is type \'%s\'",name,
                         local_28->type_name);
      return eVar1;
    }
    if (out == (double *)0x0) {
      if (ctxt->mode == '\x01') {
        pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
      }
      eVar1 = (*ctxt->print_error)(ctxt,3,"NULL output for \'%s\'",name);
      return eVar1;
    }
    *out = (double)local_28->field_6;
    eVar1 = 0;
  }
  if (ctxt->mode == '\x01') {
    pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_get_double (
    exr_const_context_t ctxt, int part_index, const char* name, double* out)
{
    ATTR_GET_IMPL (EXR_ATTR_DOUBLE, d);
}